

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O0

void __thiscall
pstore::index::
hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
::hamt_map(hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
           *this,database *db,typed_address<pstore::index::header_block> pos,u128_hash *hash,
          equal_to<pstore::uint128> *equal)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  index_pointer local_68 [8];
  index_pointer root;
  undefined1 local_58 [8];
  shared_ptr<const_pstore::index::header_block> hb;
  equal_to<pstore::uint128> *equal_local;
  u128_hash *hash_local;
  database *db_local;
  hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *this_local;
  typed_address<pstore::index::header_block> pos_local;
  
  this_local = (hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                *)pos.a_.a_;
  index_base::index_base(&this->super_index_base);
  (this->super_index_base)._vptr_index_base = (_func_int **)&PTR__hamt_map_00182048;
  std::
  make_unique<pstore::chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>>();
  uVar2 = database::get_current_revision(db);
  this->revision_ = uVar2;
  details::index_pointer::index_pointer((index_pointer *)&(this->root_).addr_);
  this->size_ = 0;
  hb.super___shared_ptr<const_pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          typed_address<pstore::index::header_block>::null();
  bVar1 = typed_address<pstore::index::header_block>::operator!=
                    ((typed_address<pstore::index::header_block> *)&this_local,
                     (typed_address<pstore::index::header_block> *)
                     &hb.
                      super___shared_ptr<const_pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  if (bVar1) {
    root.internal_ = (internal_node *)this_local;
    database::getro<pstore::index::header_block,void>
              ((database *)local_58,(typed_address<pstore::index::header_block>)db);
    peVar3 = std::
             __shared_ptr_access<const_pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_58);
    bVar1 = std::operator!=(&peVar3->signature,
                            (array<unsigned_char,_8UL> *)
                            &hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
                             ::index_signature);
    if (bVar1) {
      raise<pstore::error_code>(index_corrupt);
    }
    peVar3 = std::
             __shared_ptr_access<const_pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_58);
    details::index_pointer::index_pointer(local_68,(address)(peVar3->root).a_);
    bVar1 = details::index_pointer::is_heap(local_68);
    if ((((bVar1) ||
         ((peVar3 = std::
                    __shared_ptr_access<const_pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<const_pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_58), peVar3->size == 0 &&
          (bVar1 = details::index_pointer::is_empty(local_68), !bVar1)))) ||
        ((peVar3 = std::
                   __shared_ptr_access<const_pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<const_pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_58), peVar3->size != 0 &&
         (bVar1 = details::index_pointer::is_empty(local_68), bVar1)))) ||
       (((peVar3 = std::
                   __shared_ptr_access<const_pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<const_pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_58), peVar3->size == 1 &&
         (bVar1 = details::index_pointer::is_leaf(local_68), !bVar1)) ||
        ((peVar3 = std::
                   __shared_ptr_access<const_pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<const_pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_58), 1 < peVar3->size &&
         (bVar1 = details::index_pointer::is_internal(local_68), !bVar1)))))) {
      raise<pstore::error_code>(index_corrupt);
    }
    peVar3 = std::
             __shared_ptr_access<const_pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_58);
    this->size_ = peVar3->size;
    peVar3 = std::
             __shared_ptr_access<const_pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_58);
    details::index_pointer::operator=((index_pointer *)&(this->root_).addr_,&peVar3->root);
    std::shared_ptr<const_pstore::index::header_block>::~shared_ptr
              ((shared_ptr<const_pstore::index::header_block> *)local_58);
  }
  return;
}

Assistant:

hamt_map<KeyType, ValueType, Hash, KeyEqual>::hamt_map (
            database const & db, typed_address<header_block> const pos, Hash const & hash,
            KeyEqual const & equal)
                : internals_container_{std::make_unique<internal_nodes_container> ()}
                , revision_{db.get_current_revision ()}
                , hash_{hash}
                , equal_{equal} {

            if (pos != typed_address<header_block>::null ()) {
                // 'pos' points to the index header block which gives us the tree root and size.
                std::shared_ptr<header_block const> const hb = db.getro (pos);
                // Check that this block appears to be sensible.
#if PSTORE_SIGNATURE_CHECKS_ENABLED
                if (hb->signature != index_signature) {
                    raise (pstore::error_code::index_corrupt);
                }
#endif

                {
                    auto const root = index_pointer{hb->root};
                    if (root.is_heap () || (hb->size == 0U && !root.is_empty ()) ||
                        (hb->size > 0U && root.is_empty ()) ||
                        (hb->size == 1U && !root.is_leaf ()) ||
                        (hb->size > 1U && !root.is_internal ())) {

                        raise (pstore::error_code::index_corrupt);
                    }
                }
                size_ = hb->size;
                root_ = hb->root;
            }
        }